

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_hsort(void)

{
  uint32_t uVar1;
  int iVar2;
  int interval;
  int n;
  int j;
  int i;
  size_t counter;
  int ints [64];
  size_t in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint32_t in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  int iVar3;
  undefined4 in_stack_fffffffffffffeec;
  int iVar4;
  size_t size;
  size_t in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  
  memset(&stack0xfffffffffffffef8,0,0x100);
  size = 0;
  secp256k1_hsort(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0,
                  (_func_int_void_ptr_void_ptr_void_ptr *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                  (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (size != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x23c,"test condition failed: counter == 0");
    abort();
  }
  secp256k1_hsort(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0,
                  (_func_int_void_ptr_void_ptr_void_ptr *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                  (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (size != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x23e,"test condition failed: counter == 0");
    abort();
  }
  secp256k1_hsort(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0,
                  (_func_int_void_ptr_void_ptr_void_ptr *)
                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                  (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (size == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x240,"test condition failed: counter > 0");
    abort();
  }
  test_hsort_is_sorted
            ((int *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  for (iVar4 = 0; iVar4 < COUNT; iVar4 = iVar4 + 1) {
    in_stack_fffffffffffffee4 = secp256k1_testrand_int(in_stack_fffffffffffffee4);
    uVar1 = secp256k1_testrand_int(in_stack_fffffffffffffee4);
    iVar2 = uVar1 + 1;
    for (iVar3 = 0; iVar3 < (int)in_stack_fffffffffffffee4; iVar3 = iVar3 + 1) {
      uVar1 = secp256k1_testrand_int(in_stack_fffffffffffffee4);
      *(uint32_t *)(&stack0xfffffffffffffef8 + (long)iVar3 * 4) = uVar1 - iVar2 / 2;
    }
    secp256k1_hsort(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,size,
                    (_func_int_void_ptr_void_ptr_void_ptr *)CONCAT44(iVar4,iVar3),
                    (void *)CONCAT44(in_stack_fffffffffffffee4,iVar2));
    test_hsort_is_sorted((int *)CONCAT44(in_stack_fffffffffffffee4,iVar2),in_stack_fffffffffffffed8)
    ;
  }
  return;
}

Assistant:

static void test_hsort(void) {
    int ints[NUM] = { 0 };
    size_t counter = 0;
    int i, j;

    secp256k1_hsort(ints, 0, sizeof(ints[0]), test_hsort_cmp, &counter);
    CHECK(counter == 0);
    secp256k1_hsort(ints, 1, sizeof(ints[0]), test_hsort_cmp, &counter);
    CHECK(counter == 0);
    secp256k1_hsort(ints, NUM, sizeof(ints[0]), test_hsort_cmp, &counter);
    CHECK(counter > 0);
    test_hsort_is_sorted(ints, NUM);

    /* Test hsort with length n array and random elements in
     * [-interval/2, interval/2] */
    for (i = 0; i < COUNT; i++) {
        int n = secp256k1_testrand_int(NUM);
        int interval = secp256k1_testrand_int(63) + 1;
        for (j = 0; j < n; j++) {
            ints[j] = secp256k1_testrand_int(interval) - interval/2;
        }
        secp256k1_hsort(ints, n, sizeof(ints[0]), test_hsort_cmp, &counter);
        test_hsort_is_sorted(ints, n);
    }
}